

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filters_sse2.c
# Opt level: O0

void VerticalUnfilter_SSE2(uint8_t *prev,uint8_t *in,uint8_t *out,int width)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 *puVar9;
  uint in_ECX;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  __m128i C1;
  __m128i C0;
  __m128i B1;
  __m128i B0;
  __m128i A1;
  __m128i A0;
  int max_pos;
  int i;
  undefined1 in_stack_fffffffffffffef4;
  undefined1 in_stack_fffffffffffffef5;
  undefined1 in_stack_fffffffffffffef6;
  undefined1 in_stack_fffffffffffffef7;
  uint8_t *in_stack_fffffffffffffef8;
  uint8_t *in_stack_ffffffffffffff00;
  uint8_t *in_stack_ffffffffffffff08;
  int local_b8;
  char local_98;
  char cStack_97;
  char cStack_96;
  char cStack_95;
  char cStack_94;
  char cStack_93;
  char cStack_92;
  char cStack_91;
  char cStack_90;
  char cStack_8f;
  char cStack_8e;
  char cStack_8d;
  char cStack_8c;
  char cStack_8b;
  char cStack_8a;
  char cStack_89;
  char local_88;
  char cStack_87;
  char cStack_86;
  char cStack_85;
  char cStack_84;
  char cStack_83;
  char cStack_82;
  char cStack_81;
  char cStack_80;
  char cStack_7f;
  char cStack_7e;
  char cStack_7d;
  char cStack_7c;
  char cStack_7b;
  char cStack_7a;
  char cStack_79;
  char local_78;
  char cStack_77;
  char cStack_76;
  char cStack_75;
  char cStack_74;
  char cStack_73;
  char cStack_72;
  char cStack_71;
  char cStack_70;
  char cStack_6f;
  char cStack_6e;
  char cStack_6d;
  char cStack_6c;
  char cStack_6b;
  char cStack_6a;
  char cStack_69;
  char local_68;
  char cStack_67;
  char cStack_66;
  char cStack_65;
  char cStack_64;
  char cStack_63;
  char cStack_62;
  char cStack_61;
  char cStack_60;
  char cStack_5f;
  char cStack_5e;
  char cStack_5d;
  char cStack_5c;
  char cStack_5b;
  char cStack_5a;
  char cStack_59;
  
  if (in_RDI == 0) {
    HorizontalUnfilter_SSE2
              (in_stack_ffffffffffffff08,in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,
               CONCAT13(in_stack_fffffffffffffef7,
                        CONCAT12(in_stack_fffffffffffffef6,
                                 CONCAT11(in_stack_fffffffffffffef5,in_stack_fffffffffffffef4))));
  }
  else {
    for (local_b8 = 0; local_b8 < (int)(in_ECX & 0xffffffe0); local_b8 = local_b8 + 0x20) {
      uVar1 = *(undefined8 *)(in_RSI + local_b8);
      uVar2 = ((undefined8 *)(in_RSI + local_b8))[1];
      puVar9 = (undefined8 *)(in_RSI + (local_b8 + 0x10));
      uVar3 = *puVar9;
      uVar4 = puVar9[1];
      uVar5 = *(undefined8 *)(in_RDI + local_b8);
      uVar6 = ((undefined8 *)(in_RDI + local_b8))[1];
      puVar9 = (undefined8 *)(in_RDI + (local_b8 + 0x10));
      uVar7 = *puVar9;
      uVar8 = puVar9[1];
      local_68 = (char)uVar1;
      cStack_67 = (char)((ulong)uVar1 >> 8);
      cStack_66 = (char)((ulong)uVar1 >> 0x10);
      cStack_65 = (char)((ulong)uVar1 >> 0x18);
      cStack_64 = (char)((ulong)uVar1 >> 0x20);
      cStack_63 = (char)((ulong)uVar1 >> 0x28);
      cStack_62 = (char)((ulong)uVar1 >> 0x30);
      cStack_61 = (char)((ulong)uVar1 >> 0x38);
      cStack_60 = (char)uVar2;
      cStack_5f = (char)((ulong)uVar2 >> 8);
      cStack_5e = (char)((ulong)uVar2 >> 0x10);
      cStack_5d = (char)((ulong)uVar2 >> 0x18);
      cStack_5c = (char)((ulong)uVar2 >> 0x20);
      cStack_5b = (char)((ulong)uVar2 >> 0x28);
      cStack_5a = (char)((ulong)uVar2 >> 0x30);
      cStack_59 = (char)((ulong)uVar2 >> 0x38);
      local_78 = (char)uVar5;
      cStack_77 = (char)((ulong)uVar5 >> 8);
      cStack_76 = (char)((ulong)uVar5 >> 0x10);
      cStack_75 = (char)((ulong)uVar5 >> 0x18);
      cStack_74 = (char)((ulong)uVar5 >> 0x20);
      cStack_73 = (char)((ulong)uVar5 >> 0x28);
      cStack_72 = (char)((ulong)uVar5 >> 0x30);
      cStack_71 = (char)((ulong)uVar5 >> 0x38);
      cStack_70 = (char)uVar6;
      cStack_6f = (char)((ulong)uVar6 >> 8);
      cStack_6e = (char)((ulong)uVar6 >> 0x10);
      cStack_6d = (char)((ulong)uVar6 >> 0x18);
      cStack_6c = (char)((ulong)uVar6 >> 0x20);
      cStack_6b = (char)((ulong)uVar6 >> 0x28);
      cStack_6a = (char)((ulong)uVar6 >> 0x30);
      cStack_69 = (char)((ulong)uVar6 >> 0x38);
      local_88 = (char)uVar3;
      cStack_87 = (char)((ulong)uVar3 >> 8);
      cStack_86 = (char)((ulong)uVar3 >> 0x10);
      cStack_85 = (char)((ulong)uVar3 >> 0x18);
      cStack_84 = (char)((ulong)uVar3 >> 0x20);
      cStack_83 = (char)((ulong)uVar3 >> 0x28);
      cStack_82 = (char)((ulong)uVar3 >> 0x30);
      cStack_81 = (char)((ulong)uVar3 >> 0x38);
      cStack_80 = (char)uVar4;
      cStack_7f = (char)((ulong)uVar4 >> 8);
      cStack_7e = (char)((ulong)uVar4 >> 0x10);
      cStack_7d = (char)((ulong)uVar4 >> 0x18);
      cStack_7c = (char)((ulong)uVar4 >> 0x20);
      cStack_7b = (char)((ulong)uVar4 >> 0x28);
      cStack_7a = (char)((ulong)uVar4 >> 0x30);
      cStack_79 = (char)((ulong)uVar4 >> 0x38);
      local_98 = (char)uVar7;
      cStack_97 = (char)((ulong)uVar7 >> 8);
      cStack_96 = (char)((ulong)uVar7 >> 0x10);
      cStack_95 = (char)((ulong)uVar7 >> 0x18);
      cStack_94 = (char)((ulong)uVar7 >> 0x20);
      cStack_93 = (char)((ulong)uVar7 >> 0x28);
      cStack_92 = (char)((ulong)uVar7 >> 0x30);
      cStack_91 = (char)((ulong)uVar7 >> 0x38);
      cStack_90 = (char)uVar8;
      cStack_8f = (char)((ulong)uVar8 >> 8);
      cStack_8e = (char)((ulong)uVar8 >> 0x10);
      cStack_8d = (char)((ulong)uVar8 >> 0x18);
      cStack_8c = (char)((ulong)uVar8 >> 0x20);
      cStack_8b = (char)((ulong)uVar8 >> 0x28);
      cStack_8a = (char)((ulong)uVar8 >> 0x30);
      cStack_89 = (char)((ulong)uVar8 >> 0x38);
      *(undefined8 *)(in_RDX + local_b8) =
           CONCAT17(cStack_61 + cStack_71,
                    CONCAT16(cStack_62 + cStack_72,
                             CONCAT15(cStack_63 + cStack_73,
                                      CONCAT14(cStack_64 + cStack_74,
                                               CONCAT13(cStack_65 + cStack_75,
                                                        CONCAT12(cStack_66 + cStack_76,
                                                                 CONCAT11(cStack_67 + cStack_77,
                                                                          local_68 + local_78)))))))
      ;
      ((undefined8 *)(in_RDX + local_b8))[1] =
           CONCAT17(cStack_59 + cStack_69,
                    CONCAT16(cStack_5a + cStack_6a,
                             CONCAT15(cStack_5b + cStack_6b,
                                      CONCAT14(cStack_5c + cStack_6c,
                                               CONCAT13(cStack_5d + cStack_6d,
                                                        CONCAT12(cStack_5e + cStack_6e,
                                                                 CONCAT11(cStack_5f + cStack_6f,
                                                                          cStack_60 + cStack_70)))))
                            ));
      puVar9 = (undefined8 *)(in_RDX + (local_b8 + 0x10));
      *puVar9 = CONCAT17(cStack_81 + cStack_91,
                         CONCAT16(cStack_82 + cStack_92,
                                  CONCAT15(cStack_83 + cStack_93,
                                           CONCAT14(cStack_84 + cStack_94,
                                                    CONCAT13(cStack_85 + cStack_95,
                                                             CONCAT12(cStack_86 + cStack_96,
                                                                      CONCAT11(cStack_87 + cStack_97
                                                                               ,local_88 + local_98)
                                                                     ))))));
      puVar9[1] = CONCAT17(cStack_79 + cStack_89,
                           CONCAT16(cStack_7a + cStack_8a,
                                    CONCAT15(cStack_7b + cStack_8b,
                                             CONCAT14(cStack_7c + cStack_8c,
                                                      CONCAT13(cStack_7d + cStack_8d,
                                                               CONCAT12(cStack_7e + cStack_8e,
                                                                        CONCAT11(cStack_7f +
                                                                                 cStack_8f,
                                                                                 cStack_80 +
                                                                                 cStack_90)))))));
    }
    for (; local_b8 < (int)in_ECX; local_b8 = local_b8 + 1) {
      *(char *)(in_RDX + local_b8) = *(char *)(in_RSI + local_b8) + *(char *)(in_RDI + local_b8);
    }
  }
  return;
}

Assistant:

static void VerticalUnfilter_SSE2(const uint8_t* prev, const uint8_t* in,
                                  uint8_t* out, int width) {
  if (prev == NULL) {
    HorizontalUnfilter_SSE2(NULL, in, out, width);
  } else {
    int i;
    const int max_pos = width & ~31;
    assert(width >= 0);
    for (i = 0; i < max_pos; i += 32) {
      const __m128i A0 = _mm_loadu_si128((const __m128i*)&in[i +  0]);
      const __m128i A1 = _mm_loadu_si128((const __m128i*)&in[i + 16]);
      const __m128i B0 = _mm_loadu_si128((const __m128i*)&prev[i +  0]);
      const __m128i B1 = _mm_loadu_si128((const __m128i*)&prev[i + 16]);
      const __m128i C0 = _mm_add_epi8(A0, B0);
      const __m128i C1 = _mm_add_epi8(A1, B1);
      _mm_storeu_si128((__m128i*)&out[i +  0], C0);
      _mm_storeu_si128((__m128i*)&out[i + 16], C1);
    }
    for (; i < width; ++i) out[i] = (uint8_t)(in[i] + prev[i]);
  }
}